

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_tt_FindGlyphIndex(nk_tt_fontinfo *info,int unicode_codepoint)

{
  uint uVar1;
  uchar *puVar2;
  nk_ushort nVar3;
  nk_ushort nVar4;
  nk_short nVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  nk_uint nVar10;
  nk_uint nVar11;
  nk_uint nVar12;
  nk_uint start_glyph;
  nk_uint end_char;
  nk_uint start_char;
  nk_int mid;
  nk_int high;
  nk_int low;
  nk_uint ngroups;
  nk_ushort item;
  nk_ushort start;
  nk_ushort offset;
  nk_ushort end;
  nk_uint search;
  nk_uint endCount;
  nk_ushort rangeShift;
  nk_ushort entrySelector;
  nk_ushort searchRange;
  nk_ushort segcount;
  nk_uint count;
  nk_uint first;
  nk_int bytes;
  nk_ushort format;
  nk_uint index_map;
  nk_byte *data;
  int unicode_codepoint_local;
  nk_tt_fontinfo *info_local;
  
  puVar2 = info->data;
  uVar1 = info->index_map;
  nVar3 = nk_ttUSHORT(puVar2 + uVar1);
  if (nVar3 == 0) {
    nVar3 = nk_ttUSHORT(puVar2 + (ulong)uVar1 + 2);
    if (unicode_codepoint < (int)(nVar3 - 6)) {
      info_local._4_4_ = (uint)puVar2[(long)unicode_codepoint + (ulong)uVar1 + 6];
    }
    else {
      info_local._4_4_ = 0;
    }
  }
  else if (nVar3 == 6) {
    nVar3 = nk_ttUSHORT(puVar2 + (ulong)uVar1 + 6);
    uVar7 = (uint)nVar3;
    nVar3 = nk_ttUSHORT(puVar2 + (ulong)uVar1 + 8);
    if (((uint)unicode_codepoint < uVar7) || (uVar7 + nVar3 <= (uint)unicode_codepoint)) {
      info_local._4_4_ = 0;
    }
    else {
      nVar3 = nk_ttUSHORT(puVar2 + (long)(int)((unicode_codepoint - uVar7) * 2) + (ulong)uVar1 + 10)
      ;
      info_local._4_4_ = (uint)nVar3;
    }
  }
  else {
    if (nVar3 == 2) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x2bb4,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
    }
    if (nVar3 == 4) {
      nVar3 = nk_ttUSHORT(puVar2 + (ulong)uVar1 + 6);
      iVar6 = (int)(uint)nVar3 >> 1;
      nVar3 = nk_ttUSHORT(puVar2 + (ulong)uVar1 + 8);
      endCount._0_2_ = (ushort)((int)(uint)nVar3 >> 1);
      search._2_2_ = nk_ttUSHORT(puVar2 + (ulong)uVar1 + 10);
      nVar3 = nk_ttUSHORT(puVar2 + (ulong)uVar1 + 0xc);
      uVar7 = uVar1 + 0xe;
      if (unicode_codepoint < 0x10000) {
        nVar4 = nk_ttUSHORT(puVar2 + (long)(((int)(uint)nVar3 >> 1) << 1) + (ulong)uVar7);
        _item = uVar7;
        if ((int)(uint)nVar4 <= unicode_codepoint) {
          _item = ((int)(uint)nVar3 >> 1) * 2 + uVar7;
        }
        _item = _item - 2;
        for (; search._2_2_ != 0; search._2_2_ = search._2_2_ - 1) {
          iVar8 = (int)(uint)(ushort)endCount >> 1;
          endCount._0_2_ = (ushort)iVar8;
          nVar3 = nk_ttUSHORT(puVar2 + (long)(iVar8 << 1) + (ulong)_item);
          if ((int)(uint)nVar3 < unicode_codepoint) {
            _item = iVar8 * 2 + _item;
          }
        }
        uVar9 = (_item + 2) - uVar7 >> 1;
        nVar3 = nk_ttUSHORT(puVar2 + (long)(int)((uVar9 & 0xffff) << 1) + (ulong)uVar7);
        if ((int)(uint)nVar3 < unicode_codepoint) {
          __assert_fail("unicode_codepoint <= nk_ttUSHORT(data + endCount + 2*item)",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                        ,0x2bd8,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
        }
        nVar3 = nk_ttUSHORT(puVar2 + (long)(int)((uVar9 & 0xffff) << 1) +
                                     (long)(iVar6 << 1) + (ulong)uVar1 + 0x10);
        if (unicode_codepoint < (int)(uint)nVar3) {
          info_local._4_4_ = 0;
        }
        else {
          nVar4 = nk_ttUSHORT(puVar2 + (long)(int)((uVar9 & 0xffff) << 1) +
                                       (long)(iVar6 * 6) + (ulong)uVar1 + 0x10);
          if (nVar4 == 0) {
            nVar5 = nk_ttSHORT(puVar2 + (long)(int)((uVar9 & 0xffff) << 1) +
                                        (long)(iVar6 << 2) + (ulong)uVar1 + 0x10);
            info_local._4_4_ = unicode_codepoint + nVar5 & 0xffff;
          }
          else {
            nVar3 = nk_ttUSHORT(puVar2 + (long)(int)((uVar9 & 0xffff) << 1) +
                                         (long)(iVar6 * 6) +
                                         (ulong)uVar1 +
                                         (long)(int)((unicode_codepoint - (uint)nVar3) * 2) +
                                         (long)(int)(uint)nVar4 + 0x10);
            info_local._4_4_ = (uint)nVar3;
          }
        }
      }
      else {
        info_local._4_4_ = 0;
      }
    }
    else {
      if ((nVar3 != 0xc) && (nVar3 != 0xd)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                      ,0x2bfb,"int nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *, int)");
      }
      nVar10 = nk_ttULONG(puVar2 + (ulong)uVar1 + 0xc);
      mid = 0;
      while (start_char = nVar10, mid < (int)start_char) {
        nVar10 = mid + ((int)(start_char - mid) >> 1);
        nVar11 = nk_ttULONG(puVar2 + (long)(int)(nVar10 * 0xc) + (ulong)uVar1 + 0x10);
        nVar12 = nk_ttULONG(puVar2 + (long)(int)(nVar10 * 0xc) + (ulong)uVar1 + 0x14);
        if (nVar11 <= (uint)unicode_codepoint) {
          if ((uint)unicode_codepoint <= nVar12) {
            nVar10 = nk_ttULONG(puVar2 + (long)(int)(nVar10 * 0xc) + (ulong)uVar1 + 0x18);
            if (nVar3 != 0xc) {
              return nVar10;
            }
            return (nVar10 + unicode_codepoint) - nVar11;
          }
          mid = nVar10 + 1;
          nVar10 = start_char;
        }
      }
      info_local._4_4_ = 0;
    }
  }
  return info_local._4_4_;
}

Assistant:

NK_INTERN int
nk_tt_FindGlyphIndex(const struct nk_tt_fontinfo *info, int unicode_codepoint)
{
    const nk_byte *data = info->data;
    nk_uint index_map = (nk_uint)info->index_map;

    nk_ushort format = nk_ttUSHORT(data + index_map + 0);
    if (format == 0) { /* apple byte encoding */
        nk_int bytes = nk_ttUSHORT(data + index_map + 2);
        if (unicode_codepoint < bytes-6)
            return nk_ttBYTE(data + index_map + 6 + unicode_codepoint);
        return 0;
    } else if (format == 6) {
        nk_uint first = nk_ttUSHORT(data + index_map + 6);
        nk_uint count = nk_ttUSHORT(data + index_map + 8);
        if ((nk_uint) unicode_codepoint >= first && (nk_uint) unicode_codepoint < first+count)
            return nk_ttUSHORT(data + index_map + 10 + (unicode_codepoint - (int)first)*2);
        return 0;
    } else if (format == 2) {
        NK_ASSERT(0); /* @TODO: high-byte mapping for japanese/chinese/korean */
        return 0;
    } else if (format == 4) { /* standard mapping for windows fonts: binary search collection of ranges */
        nk_ushort segcount = nk_ttUSHORT(data+index_map+6) >> 1;
        nk_ushort searchRange = nk_ttUSHORT(data+index_map+8) >> 1;
        nk_ushort entrySelector = nk_ttUSHORT(data+index_map+10);
        nk_ushort rangeShift = nk_ttUSHORT(data+index_map+12) >> 1;

        /* do a binary search of the segments */
        nk_uint endCount = index_map + 14;
        nk_uint search = endCount;

        if (unicode_codepoint > 0xffff)
            return 0;

        /* they lie from endCount .. endCount + segCount */
        /* but searchRange is the nearest power of two, so... */
        if (unicode_codepoint >= nk_ttUSHORT(data + search + rangeShift*2))
            search += (nk_uint)(rangeShift*2);

        /* now decrement to bias correctly to find smallest */
        search -= 2;
        while (entrySelector) {
            nk_ushort end;
            searchRange >>= 1;
            end = nk_ttUSHORT(data + search + searchRange*2);
            if (unicode_codepoint > end)
                search += (nk_uint)(searchRange*2);
            --entrySelector;
        }
        search += 2;

      {
         nk_ushort offset, start;
         nk_ushort item = (nk_ushort) ((search - endCount) >> 1);

         NK_ASSERT(unicode_codepoint <= nk_ttUSHORT(data + endCount + 2*item));
         start = nk_ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = nk_ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (nk_ushort) (unicode_codepoint + nk_ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return nk_ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
        nk_uint ngroups = nk_ttULONG(data+index_map+12);
        nk_int low,high;
        low = 0; high = (nk_int)ngroups;
        /* Binary search the right group. */
        while (low < high) {
            nk_int mid = low + ((high-low) >> 1); /* rounds down, so low <= mid < high */
            nk_uint start_char = nk_ttULONG(data+index_map+16+mid*12);
            nk_uint end_char = nk_ttULONG(data+index_map+16+mid*12+4);
            if ((nk_uint) unicode_codepoint < start_char)
                high = mid;
            else if ((nk_uint) unicode_codepoint > end_char)
                low = mid+1;
            else {
                nk_uint start_glyph = nk_ttULONG(data+index_map+16+mid*12+8);
                if (format == 12)
                    return (int)start_glyph + (int)unicode_codepoint - (int)start_char;
                else /* format == 13 */
                    return (int)start_glyph;
            }
        }
        return 0; /* not found */
    }
    /* @TODO */
    NK_ASSERT(0);
    return 0;
}